

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

int __thiscall
notch::core::AdaDelta::clone
          (AdaDelta *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)operator_new(0x20);
  *pp_Var1 = (_func_int *)&PTR_update_0012ec48;
  pp_Var1[1] = *(_func_int **)(__fn + 8);
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  (this->super_ALearningPolicy)._vptr_ALearningPolicy = pp_Var1;
  return (int)this;
}

Assistant:

virtual std::unique_ptr<ALearningPolicy> clone() const {
        float m = momentum;
        float e = epsilon;
        auto c = std::unique_ptr<ALearningPolicy>(new AdaDelta(m, e));
        return c;
    }